

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

void lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)

{
  lws *wsi;
  char *pcVar1;
  int iVar2;
  time_t tVar3;
  lws_sorted_usec_list_t *plVar4;
  char **ppcVar5;
  long lVar6;
  char buf [256];
  
  tVar3 = time((time_t *)0x0);
  for (plVar4 = (lws_sorted_usec_list_t *)sul[5].list.prev; plVar4 != (lws_sorted_usec_list_t *)0x0;
      plVar4 = (lws_sorted_usec_list_t *)(plVar4->list).prev) {
    if ((((*(char *)((long)&plVar4[0x18].list.prev + 2) != '\0') &&
         (wsi = (lws *)(plVar4->list).next, wsi != (lws *)0x0)) && (plVar4[0x13].us != 0)) &&
       ((wsi->vhost == (lws_vhost *)0x0 ||
        ((long)wsi->vhost->timeout_secs_ah_idle + 0x168 <= tVar3 - plVar4[0x13].us)))) {
      buf[0] = '\0';
      lws_get_peer_simple(wsi,buf,0x100);
      _lws_log(4,"ah excessive hold: wsi %p\n  peer address: %s\n  ah pos %lu\n",wsi,buf,
               (ulong)*(uint *)((long)&plVar4[0x17].list.next + 4));
      buf[0] = '\0';
      ppcVar5 = set;
      for (lVar6 = 0; lVar6 != 0x57; lVar6 = lVar6 + 1) {
        pcVar1 = *ppcVar5;
        iVar2 = lws_hdr_total_length(wsi,(lws_token_indexes)lVar6);
        if (iVar2 < 0x100 && iVar2 != 0) {
          iVar2 = lws_hdr_copy(wsi,buf,0x100,(lws_token_indexes)lVar6);
          if (0 < iVar2) {
            buf[0xff] = '\0';
            _lws_log(4,"   %s = %s\n",pcVar1,buf);
          }
        }
        ppcVar5 = ppcVar5 + 1;
      }
      lws_header_table_detach(wsi,0);
      __lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"excessive ah");
      plVar4 = sul + 5;
    }
  }
  return;
}

Assistant:

void
lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)
{
	struct allocated_headers *ah;
	struct lws_context_per_thread *pt = lws_container_of(sul,
			struct lws_context_per_thread, sul_ah_lifecheck);
	struct lws *wsi;
	time_t now;
	int m;

	now = time(NULL);

	lws_pt_lock(pt, __func__);

	ah = pt->http.ah_list;
	while (ah) {
		int len;
		char buf[256];
		const unsigned char *c;

		if (!ah->in_use || !ah->wsi || !ah->assigned ||
		    (ah->wsi->vhost &&
		     (now - ah->assigned) <
		     ah->wsi->vhost->timeout_secs_ah_idle + 360)) {
			ah = ah->next;
			continue;
		}

		/*
		 * a single ah session somehow got held for
		 * an unreasonable amount of time.
		 *
		 * Dump info on the connection...
		 */
		wsi = ah->wsi;
		buf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
		lws_get_peer_simple(wsi, buf, sizeof(buf));
#else
		buf[0] = '\0';
#endif
		lwsl_notice("ah excessive hold: wsi %p\n"
			    "  peer address: %s\n"
			    "  ah pos %lu\n",
			    wsi, buf, (unsigned long)ah->pos);
		buf[0] = '\0';
		m = 0;
		do {
			c = lws_token_to_string(m);
			if (!c)
				break;
			if (!(*c))
				break;

			len = lws_hdr_total_length(wsi, m);
			if (!len || len > (int)sizeof(buf) - 1) {
				m++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, m) > 0) {
				buf[sizeof(buf) - 1] = '\0';

				lwsl_notice("   %s = %s\n",
					    (const char *)c, buf);
			}
			m++;
		} while (1);

		/* explicitly detach the ah */
		lws_header_table_detach(wsi, 0);

		/* ... and then drop the connection */

		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					     "excessive ah");

		ah = pt->http.ah_list;
	}

	lws_pt_unlock(pt);
}